

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_free(roaring_bitmap_t *r)

{
  _Bool _Var1;
  roaring_bitmap_t *in_RDI;
  
  if (in_RDI != (roaring_bitmap_t *)0x0) {
    _Var1 = is_frozen(in_RDI);
    if (!_Var1) {
      ra_clear((roaring_array_t *)0x103ea4);
    }
    roaring_free((void *)0x103ead);
  }
  return;
}

Assistant:

void roaring_bitmap_free(const roaring_bitmap_t *r) {
    if (r == NULL) {
        return;
    }
    if (!is_frozen(r)) {
        ra_clear((roaring_array_t *)&r->high_low_container);
    }
    roaring_free((roaring_bitmap_t *)r);
}